

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
* toml::detail::parse_array_table_key<toml::type_config>
            (result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
             *__return_storage_ptr__,location *loc,context<toml::type_config> *ctx)

{
  size_t *psVar1;
  string *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  element_type *peVar4;
  long lVar5;
  undefined8 v;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  ulong uVar7;
  error_type *v_00;
  value_type *pvVar8;
  ulong uVar9;
  size_t sVar10;
  toml *this;
  ulong uVar11;
  size_t sVar12;
  region reg;
  result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
  keys_res;
  location first;
  string local_3a8;
  string local_388;
  undefined1 local_368 [48];
  pointer local_338;
  element_type *peStack_330;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_328;
  pointer pcStack_320;
  size_t local_318;
  size_t sStack_310;
  size_t local_308;
  undefined1 local_2f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2d8;
  undefined8 local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0 [4];
  location local_270;
  undefined1 local_228 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_208;
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
  *local_200;
  size_type local_1f8;
  undefined1 local_1f0 [152];
  success<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>_>
  local_158;
  EVP_PKEY_CTX local_d8 [88];
  failure<toml::error_info> local_80;
  
  location::location(&local_270,loc);
  syntax::array_table((sequence *)local_2f8,&ctx->toml_spec_);
  sequence::scan((region *)local_368,(sequence *)local_2f8,loc);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          (local_2f8 + 8));
  if ((element_type *)local_368._0_8_ == (element_type *)0x0) {
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_388,"toml::parse_array_table_key: invalid array-of-tables key","");
    syntax::array_table((sequence *)local_228,&ctx->toml_spec_);
    location::location((location *)(local_1f0 + 0x50),loc);
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"");
    make_syntax_error<toml::detail::sequence>
              ((error_info *)local_2f8,&local_388,(sequence *)local_228,
               (location *)(local_1f0 + 0x50),&local_3a8);
    err<toml::error_info>(&local_80,(error_info *)local_2f8);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_80);
    failure<toml::error_info>::~failure(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0 != local_2b0) {
      operator_delete((void *)local_2c0,local_2b0[0]._M_allocated_capacity + 1);
    }
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2f8._1_7_,local_2f8[0]) != &local_2e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_2f8._1_7_,local_2f8[0]),
                      (ulong)(local_2e8._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    location::~location((location *)(local_1f0 + 0x50));
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )(local_228 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (loc->source_).
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = local_270.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(loc->source_).
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_270.source_.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &loc->source_name_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &local_270.source_name_);
    psVar1 = &loc->location_;
    loc->location_ = local_270.location_;
    loc->line_number_ = local_270.line_number_;
    loc->column_number_ = local_270.column_number_;
    uVar9 = loc->location_;
    peVar4 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    lVar5 = (long)(peVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    uVar7 = (long)(peVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish - lVar5;
    if (uVar9 + 1 < uVar7) {
      if (*(char *)(lVar5 + uVar9) == '\n') {
        loc->line_number_ = loc->line_number_ + 1;
        sVar10 = 1;
      }
      else {
        sVar10 = loc->column_number_ + 1;
      }
      loc->column_number_ = sVar10;
      uVar9 = uVar9 + 1;
    }
    else if (uVar7 != uVar9) {
      sVar10 = loc->line_number_;
      sVar12 = loc->column_number_;
      uVar11 = uVar9;
      do {
        if (*(char *)(lVar5 + uVar11) == '\n') {
          sVar10 = sVar10 + 1;
          loc->line_number_ = sVar10;
          sVar12 = 1;
        }
        else {
          sVar12 = sVar12 + 1;
        }
        loc->column_number_ = sVar12;
        uVar11 = uVar11 + 1;
        uVar9 = uVar7;
      } while (uVar7 != uVar11);
    }
    *psVar1 = uVar9;
    if (uVar9 + 1 < uVar7) {
      if (*(char *)(lVar5 + uVar9) == '\n') {
        loc->line_number_ = loc->line_number_ + 1;
        sVar10 = 1;
      }
      else {
        sVar10 = loc->column_number_ + 1;
      }
      loc->column_number_ = sVar10;
      uVar7 = uVar9 + 1;
    }
    else if (uVar7 != uVar9) {
      sVar10 = loc->line_number_;
      sVar12 = loc->column_number_;
      do {
        if (*(char *)(lVar5 + uVar9) == '\n') {
          sVar10 = sVar10 + 1;
          loc->line_number_ = sVar10;
          sVar12 = 1;
        }
        else {
          sVar12 = sVar12 + 1;
        }
        loc->column_number_ = sVar12;
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
    }
    loc->location_ = uVar7;
    skip_whitespace<toml::type_config>(loc,ctx);
    parse_key<toml::type_config>
              ((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                *)local_2f8,loc,ctx);
    if (local_2f8[0] == false) {
      v_00 = result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
             ::unwrap_err((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                           *)local_2f8,(source_location)0x560548);
      err<toml::error_info>((failure<toml::error_info> *)local_d8,v_00);
      __return_storage_ptr__->is_ok_ = false;
      this = (toml *)local_d8;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                 (failure<toml::error_info> *)local_d8);
      failure<toml::error_info>::~failure((failure<toml::error_info> *)local_d8);
    }
    else {
      skip_whitespace<toml::type_config>(loc,ctx);
      peVar4 = (loc->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      uVar9 = loc->location_;
      lVar5 = (long)(peVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
      uVar7 = (long)(peVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish - lVar5;
      if (uVar9 + 1 < uVar7) {
        if (*(char *)(lVar5 + uVar9) == '\n') {
          loc->line_number_ = loc->line_number_ + 1;
          sVar10 = 1;
        }
        else {
          sVar10 = loc->column_number_ + 1;
        }
        loc->column_number_ = sVar10;
        uVar9 = uVar9 + 1;
      }
      else if (uVar7 != uVar9) {
        sVar10 = loc->line_number_;
        sVar12 = loc->column_number_;
        uVar11 = uVar9;
        do {
          if (*(char *)(lVar5 + uVar11) == '\n') {
            sVar10 = sVar10 + 1;
            loc->line_number_ = sVar10;
            sVar12 = 1;
          }
          else {
            sVar12 = sVar12 + 1;
          }
          loc->column_number_ = sVar12;
          uVar11 = uVar11 + 1;
          uVar9 = uVar7;
        } while (uVar7 != uVar11);
      }
      *psVar1 = uVar9;
      if (uVar9 + 1 < uVar7) {
        if (*(char *)(lVar5 + uVar9) == '\n') {
          loc->line_number_ = loc->line_number_ + 1;
          sVar10 = 1;
        }
        else {
          sVar10 = loc->column_number_ + 1;
        }
        loc->column_number_ = sVar10;
        uVar7 = uVar9 + 1;
      }
      else if (uVar7 != uVar9) {
        sVar10 = loc->line_number_;
        sVar12 = loc->column_number_;
        do {
          if (*(char *)(lVar5 + uVar9) == '\n') {
            sVar10 = sVar10 + 1;
            loc->line_number_ = sVar10;
            sVar12 = 1;
          }
          else {
            sVar12 = sVar12 + 1;
          }
          loc->column_number_ = sVar12;
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
      *psVar1 = uVar7;
      pvVar8 = result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
               ::unwrap((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                         *)local_2f8,(source_location)0x560560);
      v = local_368._16_8_;
      local_228._0_8_ =
           (pvVar8->first).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_228._8_8_ =
           (pvVar8->first).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_200 = (pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
                   *)local_1f0;
      local_228._16_8_ =
           (pvVar8->first).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pvVar8->first).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar8->first).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pvVar8->first).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_228._24_8_ = local_368._0_8_;
      p_Stack_208 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_;
      local_368._0_8_ = (element_type *)0x0;
      local_368._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
           *)local_368._16_8_ ==
          (pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
           *)(local_368 + 0x20)) {
        local_1f0._8_8_ = local_368._40_8_;
      }
      else {
        local_200 = (pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
                     *)local_368._16_8_;
      }
      local_1f8 = local_368._24_8_;
      local_368._24_8_ = 0;
      local_368[0x20] = '\0';
      local_1f0._16_8_ = local_338;
      local_1f0._24_8_ = peStack_330;
      local_1f0._32_8_ = local_328;
      local_1f0._40_8_ = pcStack_320;
      local_1f0._48_8_ = local_318;
      local_1f0._56_8_ = sStack_310;
      local_1f0._64_8_ = local_308;
      this = (toml *)local_228;
      local_368._16_8_ =
           (pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
            *)(local_368 + 0x20);
      ok<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,toml::detail::region>>
                (&local_158,this,
                 (pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
                  *)v);
      _Var6._M_pi = local_158.value.second.source_.
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      __return_storage_ptr__->is_ok_ = true;
      (__return_storage_ptr__->field_1).succ_.value.first.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_158.value.first.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->field_1).succ_.value.first.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_158.value.first.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->field_1).succ_.value.first.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_158.value.first.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_158.value.first.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158.value.first.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.value.first.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.value.second.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->field_1).succ_.value.second.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_158.value.second.source_.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (__return_storage_ptr__->field_1).succ_.value.second.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = _Var6._M_pi;
      local_158.value.second.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      psVar2 = &(__return_storage_ptr__->field_1).fail_.value.suffix_;
      (__return_storage_ptr__->field_1).succ_.value.second.source_name_._M_dataplus._M_p =
           (pointer)psVar2;
      paVar3 = &local_158.value.second.source_name_.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158.value.second.source_name_._M_dataplus._M_p == paVar3) {
        (psVar2->_M_dataplus)._M_p =
             (pointer)CONCAT71(local_158.value.second.source_name_.field_2._M_allocated_capacity.
                               _1_7_,local_158.value.second.source_name_.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->field_1).succ_.value.second.source_name_.field_2 + 8) =
             local_158.value.second.source_name_.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->field_1).succ_.value.second.source_name_._M_dataplus._M_p =
             local_158.value.second.source_name_._M_dataplus._M_p;
        (__return_storage_ptr__->field_1).fail_.value.suffix_._M_dataplus._M_p =
             (pointer)CONCAT71(local_158.value.second.source_name_.field_2._M_allocated_capacity.
                               _1_7_,local_158.value.second.source_name_.field_2._M_local_buf[0]);
      }
      (__return_storage_ptr__->field_1).succ_.value.second.source_name_._M_string_length =
           local_158.value.second.source_name_._M_string_length;
      local_158.value.second.source_name_._M_string_length = 0;
      local_158.value.second.source_name_.field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->field_1).succ_.value.second.last_column_ =
           local_158.value.second.last_column_;
      (__return_storage_ptr__->field_1).succ_.value.second.last_ = local_158.value.second.last_;
      (__return_storage_ptr__->field_1).succ_.value.second.last_line_ =
           local_158.value.second.last_line_;
      (__return_storage_ptr__->field_1).succ_.value.second.first_line_ =
           local_158.value.second.first_line_;
      (__return_storage_ptr__->field_1).succ_.value.second.first_column_ =
           local_158.value.second.first_column_;
      (__return_storage_ptr__->field_1).succ_.value.second.length_ = local_158.value.second.length_;
      (__return_storage_ptr__->field_1).succ_.value.second.first_ = local_158.value.second.first_;
      local_158.value.second.source_name_._M_dataplus._M_p = (pointer)paVar3;
      region::~region(&local_158.value.second);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_158);
      region::~region((region *)(local_228 + 0x18));
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_228);
    }
    result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
    ::cleanup((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
               *)local_2f8,(EVP_PKEY_CTX *)this);
  }
  region::~region((region *)local_368);
  location::~location(&local_270);
  return __return_storage_ptr__;
}

Assistant:

result<std::pair<std::vector<typename basic_value<TC>::key_type>, region>, error_info>
parse_array_table_key(location& loc, context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    auto reg = syntax::array_table(spec).scan(loc);
    if(!reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_array_table_key: invalid array-of-tables key",
            syntax::array_table(spec), loc));
    }

    loc = first;
    loc.advance(); // [
    loc.advance(); // [
    skip_whitespace(loc, ctx);

    auto keys_res = parse_key(loc, ctx);
    if(keys_res.is_err())
    {
        return err(std::move(keys_res.unwrap_err()));
    }

    skip_whitespace(loc, ctx);
    loc.advance(); // ]
    loc.advance(); // ]

    return ok(std::make_pair(std::move(keys_res.unwrap().first), std::move(reg)));
}